

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O2

bool multicastMembershipHelper
               (QNativeSocketEnginePrivate *d,int how6,int how4,QHostAddress *groupAddress,
               QNetworkInterface *interface)

{
  bool bVar1;
  NetworkLayerProtocol NVar2;
  int iVar3;
  quint32 qVar4;
  char *pcVar5;
  int *piVar6;
  SocketError errorString;
  SocketError error;
  undefined4 in_register_00000034;
  socklen_t __optlen;
  ip_mreq *__optval;
  long lVar7;
  long in_FS_OFFSET;
  QHostAddress ip;
  QArrayDataPointer<QNetworkAddressEntry> local_78;
  ip_mreq mreq4;
  undefined1 local_58 [16];
  undefined4 local_48;
  long local_38;
  
  pcVar5 = (char *)CONCAT44(in_register_00000034,how6);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  mreq4 = (ip_mreq)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = 0xaaaaaaaa;
  NVar2 = QHostAddress::protocol(groupAddress);
  if (NVar2 == IPv6Protocol) {
    local_58 = (undefined1  [16])QHostAddress::toIPv6Address(groupAddress);
    __optval = (ip_mreq *)local_58;
    pcVar5 = QNetworkInterface::index((QNetworkInterface *)interface,pcVar5,local_58._8_4_);
    local_48 = SUB84(pcVar5,0);
    iVar3 = 0x29;
    __optlen = 0x14;
    goto LAB_00216d52;
  }
  NVar2 = QHostAddress::protocol(groupAddress);
  if (NVar2 == IPv4Protocol) {
    mreq4.imr_multiaddr.s_addr = 0;
    mreq4.imr_interface.s_addr = 0;
    iVar3 = 0;
    qVar4 = QHostAddress::toIPv4Address(groupAddress,(bool *)0x0);
    mreq4.imr_multiaddr.s_addr =
         qVar4 >> 0x18 | (qVar4 & 0xff0000) >> 8 | (qVar4 & 0xff00) << 8 | qVar4 << 0x18;
    bVar1 = QNetworkInterface::isValid((QNetworkInterface *)interface);
    how6 = how4;
    if (!bVar1) {
      __optval = &mreq4;
      mreq4 = (ip_mreq)((ulong)mreq4 & 0xffffffff);
      __optlen = 8;
LAB_00216d52:
      iVar3 = setsockopt((int)d->socketDescriptor,iVar3,how6,__optval,__optlen);
      bVar1 = true;
      if (iVar3 != -1) goto LAB_00216eae;
      piVar6 = __errno_location();
      if (*piVar6 == 99) {
        error = SocketAddressNotAvailableError;
        errorString = ProxyConnectionClosedError;
      }
      else if (*piVar6 == 0x5c) {
        error = UnsupportedSocketOperationError;
        errorString = DatagramTooLargeError;
      }
      else {
        errorString = UnknownSocketError;
        error = errorString;
      }
      goto LAB_00216ea7;
    }
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (QNetworkAddressEntry *)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkInterface::addressEntries
              ((QList<QNetworkAddressEntry> *)&local_78,(QNetworkInterface *)interface);
    lVar7 = local_78.size << 3;
    bVar1 = false;
    do {
      if (lVar7 == 0) break;
      ip.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QNetworkAddressEntry::ip((QNetworkAddressEntry *)&ip);
      NVar2 = QHostAddress::protocol(&ip);
      if (NVar2 == IPv4Protocol) {
        qVar4 = QHostAddress::toIPv4Address(&ip,(bool *)0x0);
        mreq4.imr_interface.s_addr =
             qVar4 >> 0x18 | (qVar4 & 0xff0000) >> 8 | (qVar4 & 0xff00) << 8 | qVar4 << 0x18;
        bVar1 = true;
      }
      QHostAddress::~QHostAddress(&ip);
      lVar7 = lVar7 + -8;
    } while (NVar2 != IPv4Protocol);
    if (bVar1) {
      QArrayDataPointer<QNetworkAddressEntry>::~QArrayDataPointer(&local_78);
      iVar3 = 0;
      __optval = &mreq4;
      __optlen = 8;
      goto LAB_00216d52;
    }
    QNativeSocketEnginePrivate::setError(d,NetworkError,NetworkUnreachableErrorString);
    QArrayDataPointer<QNetworkAddressEntry>::~QArrayDataPointer(&local_78);
  }
  else {
    error = UnsupportedSocketOperationError;
    errorString = NetworkError;
LAB_00216ea7:
    QNativeSocketEnginePrivate::setError(d,error,errorString);
  }
  bVar1 = false;
LAB_00216eae:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

static bool multicastMembershipHelper(QNativeSocketEnginePrivate *d,
                                      int how6,
                                      int how4,
                                      const QHostAddress &groupAddress,
                                      const QNetworkInterface &interface)
{
    int level = 0;
    int sockOpt = 0;
    void *sockArg;
    int sockArgSize;

    ip_mreq mreq4;
    ipv6_mreq mreq6;

    if (groupAddress.protocol() == QAbstractSocket::IPv6Protocol) {
        level = IPPROTO_IPV6;
        sockOpt = how6;
        sockArg = &mreq6;
        sockArgSize = sizeof(mreq6);
        memset(&mreq6, 0, sizeof(mreq6));
        Q_IPV6ADDR ip6 = groupAddress.toIPv6Address();
        memcpy(&mreq6.ipv6mr_multiaddr, &ip6, sizeof(ip6));
        mreq6.ipv6mr_interface = interface.index();
    } else if (groupAddress.protocol() == QAbstractSocket::IPv4Protocol) {
        level = IPPROTO_IP;
        sockOpt = how4;
        sockArg = &mreq4;
        sockArgSize = sizeof(mreq4);
        memset(&mreq4, 0, sizeof(mreq4));
        mreq4.imr_multiaddr.s_addr = htonl(groupAddress.toIPv4Address());

        if (interface.isValid()) {
            const QList<QNetworkAddressEntry> addressEntries = interface.addressEntries();
            bool found = false;
            for (const QNetworkAddressEntry &entry : addressEntries) {
                const QHostAddress ip = entry.ip();
                if (ip.protocol() == QAbstractSocket::IPv4Protocol) {
                    mreq4.imr_interface.s_addr = htonl(ip.toIPv4Address());
                    found = true;
                    break;
                }
            }
            if (!found) {
                d->setError(QAbstractSocket::NetworkError,
                            QNativeSocketEnginePrivate::NetworkUnreachableErrorString);
                return false;
            }
        } else {
            mreq4.imr_interface.s_addr = INADDR_ANY;
        }
    } else {
        // unreachable
        d->setError(QAbstractSocket::UnsupportedSocketOperationError,
                    QNativeSocketEnginePrivate::ProtocolUnsupportedErrorString);
        return false;
    }

    int res = setsockopt(d->socketDescriptor, level, sockOpt, sockArg, sockArgSize);
    if (res == -1) {
        switch (errno) {
        case ENOPROTOOPT:
            d->setError(QAbstractSocket::UnsupportedSocketOperationError,
                        QNativeSocketEnginePrivate::OperationUnsupportedErrorString);
            break;
        case EADDRNOTAVAIL:
            d->setError(QAbstractSocket::SocketAddressNotAvailableError,
                        QNativeSocketEnginePrivate::AddressNotAvailableErrorString);
            break;
        default:
            d->setError(QAbstractSocket::UnknownSocketError,
                        QNativeSocketEnginePrivate::UnknownSocketErrorString);
            break;
        }
        return false;
    }
    return true;
}